

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray-bmp.cxx
# Opt level: O3

void testSaveLoad<(andres::CoordinateOrder)0,(andres::CoordinateOrder)0>(void)

{
  reference puVar1;
  string fileName;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> m;
  size_t shape [2];
  allocator_type local_292;
  uchar local_291;
  long *local_290 [2];
  long local_280 [2];
  Marray<unsigned_char,_std::allocator<unsigned_long>_> local_270;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  unsigned_long local_218;
  undefined8 local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  local_228 = 2;
  uStack_224 = 0;
  uStack_220 = 3;
  uStack_21c = 0;
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"test.bmp","");
  local_291 = '\0';
  local_210 = (ulong)local_210._4_4_ << 0x20;
  andres::Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long_const*>
            ((Marray<unsigned_char,std::allocator<unsigned_long>> *)&local_270,
             (unsigned_long *)&local_228,&local_218,&local_291,(CoordinateOrder *)&local_210,
             &local_292);
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&local_270,0,0);
  *puVar1 = '\x7f';
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&local_270,0,2);
  *puVar1 = 0xff;
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&local_270,1,0);
  *puVar1 = 200;
  std::ofstream::ofstream(&local_210);
  std::ofstream::open((char *)&local_210,(_Ios_Openmode)local_290[0]);
  andres::bmp::save<unsigned_char>((ostream *)&local_210,&local_270);
  std::ofstream::close();
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  operator_delete(local_270.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.data_,
                  local_270.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.
                  geometry_.size_);
  operator_delete(local_270.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.
                  geometry_.shape_,
                  local_270.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.
                  geometry_.dimension_ * 0x18);
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  return;
}

Assistant:

void testSaveLoad() {
    size_t const shape[] = {2, 3};
    std::string const fileName = "test.bmp";
    {
        andres::Marray<unsigned char> m(shape, shape + 2, 0, ORDER_SAVE);
        m(0, 0) = 127;
        m(0, 2) = 255;
        m(1, 0) = 200;
        andres::bmp::save(fileName, m);
    }
    /*
    {
        andres::Marray<unsigned char> m(0, ORDER_LOAD);
        andres::png::load(fileName, m);
        test(m.coordinateOrder() == ORDER_LOAD);
        test(m.dimension() == 2);
        test(m.shape(0) == shape[0]);
        test(m.shape(1) == shape[1]);
        test(m(0, 0) == 127);
        test(m(0, 2) == 255);
        test(m(1, 0) == 200);
    }
    */
}